

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O1

mcu8str * mctools_absolute_path(mcu8str *__return_storage_ptr__,mcu8str *pathraw)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  bool bVar4;
  mcu8str path;
  mcu8str cwd;
  mcu8str local_48;
  mcu8str local_30;
  
  pcVar2 = pathraw->c_str;
  uVar1 = pathraw->size;
  local_48.buflen = uVar1 + 1;
  local_48.owns_memory = 0;
  local_48.c_str = pcVar2;
  local_48.size = uVar1;
  iVar3 = mctools_impl_has_winnamespace(pathraw);
  if (iVar3 != 0) {
    local_48.c_str = pcVar2 + 4;
    local_48.size = uVar1 - 4;
  }
  __return_storage_ptr__->c_str = mcu8str_create_empty::dummy;
  __return_storage_ptr__->size = 0;
  __return_storage_ptr__->buflen = 0;
  __return_storage_ptr__->owns_memory = 0;
  if (local_48.size != 0) {
    iVar3 = mctools_path_is_absolute(&local_48);
    if (iVar3 == 0) {
      mctools_get_current_working_dir();
      mctools_path_join(__return_storage_ptr__,&local_30,&local_48);
      pcVar2 = local_30.c_str;
      bVar4 = local_30.owns_memory != 0;
      local_30.c_str = mcu8str_dealloc::dummy;
      local_30.size = 0;
      local_30.buflen = 0;
      local_30.owns_memory = 0;
      if (pcVar2 != (char *)0x0 && bVar4) {
        free(pcVar2);
      }
    }
    else {
      mcu8str_copy(__return_storage_ptr__,&local_48);
    }
    mctools_pathseps_platform(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

mcu8str mctools_absolute_path( const mcu8str* pathraw )
  {
    mcu8str path = mctools_impl_view_no_winnamespace(pathraw);
    mcu8str res = mcu8str_create_empty();
    if ( path.size == 0 )
      return res;
#ifdef MC_IS_WINDOWS
    {
      mcwinstr wpath = mc_path2wpath( &path );
      res = mc_winstr_expand_to_fullpath_u8str( &wpath );
      mc_winstr_dealloc(&wpath);
    }
    const int not_done = (res.size == 0?1:0);
#else
    const int not_done = 1;
#endif
    if ( not_done ) {
      if ( mctools_path_is_absolute(&path) ) {
        res = mcu8str_copy( &path );
      } else {
        mcu8str cwd = mctools_get_current_working_dir();
        res = mctools_path_join( &cwd, &path );
        mcu8str_dealloc(&cwd);
      }
    }
    mctools_pathseps_platform(&res);
    return res;
  }